

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::~TPZManVector
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}